

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

void __thiscall
OpenMesh::PolyConnectivity::delete_vertex
          (PolyConnectivity *this,VertexHandle _vh,bool _delete_isolated_vertices)

{
  bool _delete_isolated_vertices_00;
  reference pvVar1;
  undefined7 in_register_00000011;
  pointer pFVar2;
  undefined1 local_70 [8];
  VFIter vf_it;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_handles;
  BaseHandle local_38;
  undefined4 local_34;
  
  vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ = 0;
  vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = 0;
  face_handles.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::reserve
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
             &vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_,8);
  local_34 = (undefined4)CONCAT71(in_register_00000011,_delete_isolated_vertices);
  Iterators::
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
  ::GenericCirculatorT
            ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              *)local_70,this,(VertexHandle)_vh.super_BaseHandle.idx_,false);
  while ((vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
         (((int)vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
           vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
          (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
           idx_ == 0))))) {
    local_38.idx_ =
         (int)Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                           *)local_70);
    if (face_handles.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
      _M_realloc_insert<OpenMesh::FaceHandle>
                ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                 &vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_,
                 (iterator)0x0,(FaceHandle *)&local_38);
    }
    else {
      ((face_handles.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
        ._M_impl.super__Vector_impl_data._M_start)->super_BaseHandle).idx_ = local_38.idx_;
      face_handles.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
      _M_impl.super__Vector_impl_data._M_start =
           face_handles.
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  *)local_70);
  }
  if ((pointer)vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ !=
      face_handles.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    _delete_isolated_vertices_00 = local_34._0_1_;
    pFVar2 = (pointer)vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_;
    do {
      delete_face(this,(FaceHandle)(pFVar2->super_BaseHandle).idx_,_delete_isolated_vertices_00);
      pFVar2 = pFVar2 + 1;
    } while (pFVar2 != face_handles.
                       super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar1 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (VPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).vertex_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (VertexHandle)_vh.super_BaseHandle.idx_);
  *(byte *)&pvVar1->status_ = (byte)pvVar1->status_ | 1;
  if (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ != 0) {
    operator_delete((void *)vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_);
  }
  return;
}

Assistant:

void PolyConnectivity::delete_vertex(VertexHandle _vh, bool _delete_isolated_vertices)
{
  // store incident faces
  std::vector<FaceHandle> face_handles;
  face_handles.reserve(8);
  for (VFIter vf_it(vf_iter(_vh)); vf_it.is_valid(); ++vf_it)
    face_handles.push_back(*vf_it);


  // delete collected faces
  std::vector<FaceHandle>::iterator fh_it(face_handles.begin()),
                                    fh_end(face_handles.end());

  for (; fh_it!=fh_end; ++fh_it)
    delete_face(*fh_it, _delete_isolated_vertices);

  status(_vh).set_deleted(true);
}